

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libquat_quat.cpp
# Opt level: O0

euler euler_from_quat(quaternion *in_quat)

{
  euler eVar1;
  float *in_RDI;
  float fVar2;
  euler temp;
  float local_c;
  float fStack_8;
  anon_union_4_2_5f91f90e_for_euler__4 local_4;
  
  memset(&local_c,0,0xc);
  if (in_RDI == (float *)0x0) {
    fprintf(_stderr,"%s: Invalid input.","euler_from_quat");
  }
  else {
    fVar2 = in_RDI[1] * in_RDI[1] + in_RDI[2] * in_RDI[2];
    local_c = atan2f((*in_RDI * in_RDI[1] + in_RDI[2] * in_RDI[3]) * 2.0,1.0 - (fVar2 + fVar2));
    fStack_8 = asinf((*in_RDI * in_RDI[2] + in_RDI[1] * in_RDI[3]) * 2.0);
    fVar2 = in_RDI[2] * in_RDI[2] + in_RDI[3] * in_RDI[3];
    local_4.yaw = atan2f((*in_RDI * in_RDI[3] + in_RDI[1] * in_RDI[2]) * 2.0,1.0 - (fVar2 + fVar2));
  }
  eVar1.field_1.pitch = fStack_8;
  eVar1.field_0.roll = local_c;
  eVar1.field_2 = local_4;
  return eVar1;
}

Assistant:

euler euler_from_quat(const quaternion *in_quat) {
    euler temp = {0.f};

    if (!in_quat)  // if null
    {
        fprintf(stderr, "%s: Invalid input.", __func__);
        return temp;
    }

    temp.roll = atan2f(
        2.f * (in_quat->w * in_quat->q1 + in_quat->q2 * in_quat->q3),
        1.f - 2.f * (in_quat->q1 * in_quat->q1 + in_quat->q2 * in_quat->q2));
    temp.pitch =
        asinf(2.f * (in_quat->w * in_quat->q2 + in_quat->q1 * in_quat->q3));
    temp.yaw = atan2f(
        2.f * (in_quat->w * in_quat->q3 + in_quat->q1 * in_quat->q2),
        1.f - 2.f * (in_quat->q2 * in_quat->q2 + in_quat->q3 * in_quat->q3));

    return temp;
}